

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void __thiscall ImRect::Add(ImRect *this,ImVec2 *p)

{
  float *pfVar1;
  float fVar2;
  
  if (p->x < (this->Min).x) {
    (this->Min).x = p->x;
  }
  if (p->y < (this->Min).y) {
    (this->Min).y = p->y;
  }
  fVar2 = p->x;
  if ((this->Max).x <= fVar2 && fVar2 != (this->Max).x) {
    (this->Max).x = fVar2;
  }
  fVar2 = p->y;
  pfVar1 = &(this->Max).y;
  if (*pfVar1 <= fVar2 && fVar2 != *pfVar1) {
    (this->Max).y = fVar2;
  }
  return;
}

Assistant:

void        Add(const ImVec2& p)                { if (Min.x > p.x)     Min.x = p.x;     if (Min.y > p.y)     Min.y = p.y;     if (Max.x < p.x)     Max.x = p.x;     if (Max.y < p.y)     Max.y = p.y; }